

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

MockSpec<TestResult_(mp::LogicalCountExpr)> * __thiscall
testing::internal::FunctionMocker<TestResult_(mp::LogicalCountExpr)>::With
          (FunctionMocker<TestResult_(mp::LogicalCountExpr)> *this,Matcher<mp::LogicalCountExpr> *m1
          )

{
  MatcherBase<mp::LogicalCountExpr> local_20;
  
  Matcher<mp::LogicalCountExpr>::Matcher((Matcher<mp::LogicalCountExpr> *)&local_20,m1);
  linked_ptr<const_testing::MatcherInterface<mp::LogicalCountExpr>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<mp::LogicalCountExpr>_> *)
             ((long)&(this->super_FunctionMockerBase<TestResult_(mp::LogicalCountExpr)>).
                     current_spec_.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<mp::LogicalCountExpr>_>.
                     super__Head_base<0UL,_testing::Matcher<mp::LogicalCountExpr>,_false>.
                     _M_head_impl.super_MatcherBase<mp::LogicalCountExpr> + 8),&local_20.impl_);
  MatcherBase<mp::LogicalCountExpr>::~MatcherBase(&local_20);
  return &(this->super_FunctionMockerBase<TestResult_(mp::LogicalCountExpr)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }